

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O2

void __thiscall
particleSamples::perform_weak_resonance_feed_down_Sigma_to_Lambda(particleSamples *this)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *pvVar5;
  pointer ppvVar6;
  uint uVar7;
  ulong uVar8;
  particle_info daughter2;
  particle_info daughter1;
  
  iVar1 = this->particle_monval;
  iVar4 = -iVar1;
  if (0 < iVar1) {
    iVar4 = iVar1;
  }
  if (iVar4 == 0xc32) {
    pvVar5 = this->resonance_list_Sigma0;
    ppvVar6 = (pvVar5->
              super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    for (uVar7 = 0; uVar8 = (ulong)uVar7,
        uVar8 < (ulong)((long)(pvVar5->
                              super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar6 >> 3);
        uVar7 = uVar7 + 1) {
      uVar3 = 0;
      while( true ) {
        lVar2 = *(long *)&(ppvVar6[uVar8]->
                          super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl
                          .super__Vector_impl_data;
        if ((ulong)(((long)*(pointer *)
                            ((long)&(ppvVar6[uVar8]->
                                    super__Vector_base<particle_info,_std::allocator<particle_info>_>
                                    )._M_impl.super__Vector_impl_data + 8) - lVar2) / 0x78) <=
            (ulong)uVar3) break;
        daughter2.mass = 0.0;
        daughter1.mass = 1.116;
        particle_decay::perform_two_body_decay
                  (this->decayer_ptr,(particle_info *)(lVar2 + (ulong)uVar3 * 0x78),&daughter1,
                   &daughter2);
        std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                  ((this->particle_list->
                   super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar8],&daughter1);
        uVar3 = uVar3 + 1;
        pvVar5 = this->resonance_list_Sigma0;
        ppvVar6 = (pvVar5->
                  super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      }
    }
  }
  return;
}

Assistant:

void particleSamples::perform_weak_resonance_feed_down_Sigma_to_Lambda() {
    if (std::abs(particle_monval) == 3122) {
        // consider Sigma^0 feed down to Lambda
        for (unsigned int iev = 0; iev < resonance_list_Sigma0->size(); iev++) {
            for (unsigned int i = 0; i < (*resonance_list_Sigma0)[iev]->size();
                 i++) {
                particle_info daughter1;
                particle_info daughter2;
                daughter1.mass = 1.116;  // mass of Lambda
                daughter2.mass = 0.0;    // mass of photon
                decayer_ptr->perform_two_body_decay(
                    (*(*resonance_list_Sigma0)[iev])[i], daughter1, daughter2);
                (*particle_list)[iev]->push_back(daughter1);
            }
        }
    }
}